

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

int __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
::copy(Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *src_00;
  Hdr *hdr;
  int iVar1;
  
  if (dst != (EVP_PKEY_CTX *)this) {
    src_00 = *(EVP_PKEY_CTX **)(dst + 0x10);
    if (src_00 == (EVP_PKEY_CTX *)0x0) {
      Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
      ::
      setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>::Construct>
                ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
                  *)this,0);
      return 0;
    }
    hdr = *(Hdr **)(dst + 8);
    if ((hdr == (Hdr *)0x0) || (((hdr->super_BufHdr).m_flags & 4) != 0)) {
      iVar1 = copy(this,*(EVP_PKEY_CTX **)dst,src_00);
      return iVar1;
    }
    ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
    ::attach(&this->
              super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ,hdr,*(AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
                    **)dst,(size_t)src_00);
  }
  return (int)(this->
              super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
              ).m_count;
}

Assistant:

size_t
	copy(const ArrayRef& src) {
		if (&src == this)
			return this->m_count;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		Hdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive))
			return copy(src, src.getCount());

		this->attach(src);
		return this->m_count;
	}